

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O0

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RSI;
  long in_RDI;
  float fVar1;
  double dVar2;
  int i_2;
  float beta;
  float gamma;
  float b;
  float a;
  float var;
  int i_1;
  float tmp;
  float mean;
  int i;
  float sqsum;
  float sum;
  float *ptr;
  int q;
  int size;
  int c;
  int h;
  int w;
  Mat *m;
  int local_1a4;
  float local_198;
  float local_194;
  int local_18c;
  int local_180;
  float local_17c;
  float local_178;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined4 local_150;
  long local_148;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined8 local_128;
  long local_120;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  long *local_f8;
  undefined8 *local_e8;
  undefined1 local_d5;
  int local_d4;
  undefined8 *local_c8;
  undefined8 *local_b8;
  long local_b0;
  long *local_a8;
  long local_a0;
  long *local_98;
  undefined8 *local_68;
  long local_48;
  undefined4 local_3c;
  long local_38;
  long local_30;
  undefined4 local_24;
  int local_20;
  int local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_104 = *(int *)((long)in_RSI + 0x2c);
  local_108 = (int)in_RSI[6];
  local_10c = (int)in_RSI[7];
  local_110 = local_104 * local_108;
  local_f8 = in_RSI;
  for (local_114 = 0; local_114 < local_10c; local_114 = local_114 + 1) {
    local_c8 = &local_168;
    local_1c = *(int *)((long)local_f8 + 0x2c);
    local_20 = (int)local_f8[6];
    local_24 = *(undefined4 *)((long)local_f8 + 0x34);
    local_120 = *local_f8 + local_f8[8] * (long)local_114 * local_f8[2];
    local_38 = local_f8[2];
    local_3c = (undefined4)local_f8[3];
    local_48 = local_f8[4];
    local_18 = &local_168;
    local_8 = (long)local_1c * (long)local_20 * local_38;
    local_b8 = &local_168;
    local_e8 = &local_168;
    local_c = 0x10;
    local_d4 = local_114;
    local_d5 = 1;
    local_168 = 0;
    local_158 = 0;
    local_150 = 0;
    local_140 = 0;
    local_13c = 0;
    local_138 = 0;
    local_134 = 0;
    local_130 = 0;
    local_128 = 0;
    local_160 = 0;
    local_178 = 0.0;
    local_17c = 0.0;
    for (local_180 = 0; local_180 < local_110; local_180 = local_180 + 1) {
      local_178 = *(float *)(local_120 + (long)local_180 * 4) + local_178;
    }
    local_178 = local_178 / (float)local_110;
    for (local_18c = 0; local_18c < local_110; local_18c = local_18c + 1) {
      fVar1 = *(float *)(local_120 + (long)local_18c * 4) - local_178;
      local_17c = fVar1 * fVar1 + local_17c;
    }
    local_68 = local_e8;
    local_30 = local_120;
    local_148 = local_48;
    if (*(int *)(in_RDI + 0xd8) == 0) {
      dVar2 = std::sqrt((double)(ulong)(uint)(local_17c / (float)local_110 +
                                             *(float *)(in_RDI + 0xd4)));
      local_194 = 1.0 / SUB84(dVar2,0);
      local_198 = -local_178 * local_194;
    }
    else {
      local_98 = (long *)(in_RDI + 0xe0);
      local_a0 = (long)local_114;
      local_194 = *(float *)(*local_98 + local_a0 * 4);
      local_a8 = (long *)(in_RDI + 0x128);
      local_b0 = (long)local_114;
      local_198 = *(float *)(*local_a8 + local_b0 * 4);
      dVar2 = std::sqrt((double)(ulong)(uint)(local_17c / (float)local_110 +
                                             *(float *)(in_RDI + 0xd4)));
      local_194 = local_194 / SUB84(dVar2,0);
      local_198 = -local_178 * local_194 + local_198;
    }
    for (local_1a4 = 0; local_1a4 < local_110; local_1a4 = local_1a4 + 1) {
      *(float *)(local_120 + (long)local_1a4 * 4) =
           *(float *)(local_120 + (long)local_1a4 * 4) * local_194 + local_198;
    }
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var + eps)) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int c = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < c; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i = 0; i < size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float a;
        float b;
        if (affine)
        {
            float gamma = gamma_data[q];
            float beta = beta_data[q];

            a = static_cast<float>(gamma / (sqrt(var + eps)));
            b = -mean * a + beta;
        }
        else
        {
            a = static_cast<float>(1.f / (sqrt(var + eps)));
            b = -mean * a;
        }

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}